

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O3

from_chars_result __thiscall
semver::parse<int,int,int>(semver *this,string_view str,range_set<int,_int,_int> *out)

{
  long lVar1;
  pointer ptVar2;
  char *pcVar3;
  errc eVar4;
  from_chars_result fVar5;
  token local_78;
  undefined1 local_68 [8];
  pointer ptStack_60;
  iterator local_58;
  token *ptStack_50;
  range_parser local_48;
  
  local_48.stream.tokens.
  super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)str._M_len;
  local_58._M_current = (token *)0x0;
  ptStack_50 = (token *)0x0;
  local_68 = (undefined1  [8])0x0;
  ptStack_60 = (pointer)0x0;
  local_48.stream.tokens.
  super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
  super__Vector_impl_data._M_finish = (token *)0x0;
  ptVar2 = local_48.stream.tokens.
           super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl
           .super__Vector_impl_data._M_start;
  local_48.stream.current = (size_t)this;
  if (this != (semver *)0x0) {
    do {
      fVar5 = detail::lexer::scan_token((lexer *)&local_48,(token_stream *)local_68);
      pcVar3 = fVar5.super_from_chars_result.ptr;
      eVar4 = fVar5.super_from_chars_result.ec;
      if (eVar4 != 0) goto LAB_00165caf;
    } while (local_48.stream.tokens.
             super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
             _M_impl.super__Vector_impl_data._M_finish < local_48.stream.current);
    local_78.lexeme =
         (char *)(&(local_48.stream.tokens.
                    super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>
                    ._M_impl.super__Vector_impl_data._M_start)->type +
                 (long)(token_type *)local_48.stream.current);
    local_78.type = eol;
    local_78.value.
    super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
    super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
    super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
    super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
    super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
    super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
         = (_Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>)
           (_Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>)
           0x0;
    ptVar2 = (pointer)local_78.lexeme;
    if (local_58._M_current != ptStack_50) {
      lVar1 = (ulong)(uint5)local_78._3_5_ << 0x18;
      (local_58._M_current)->type = (char)lVar1;
      (local_58._M_current)->value = (value_t)(short)((ulong)lVar1 >> 8);
      *(int5 *)&(local_58._M_current)->field_0x3 = (int5)((ulong)lVar1 >> 0x18);
      (local_58._M_current)->lexeme = local_78.lexeme;
      local_48.stream.tokens.
      super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
      super__Vector_impl_data._M_finish = local_58._M_current + 1;
      goto LAB_00165c56;
    }
  }
  local_78.lexeme = (char *)ptVar2;
  local_78.value.
  super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
       = (_Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>)
         (_Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>)
         0x0;
  local_78.type = eol;
  std::vector<semver::detail::token,std::allocator<semver::detail::token>>::
  _M_realloc_insert<semver::detail::token_const&>
            ((vector<semver::detail::token,std::allocator<semver::detail::token>> *)&ptStack_60,
             local_58,&local_78);
  local_48.stream.tokens.
  super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_58;
LAB_00165c56:
  local_48.stream.tokens.
  super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = ptStack_50;
  local_48.stream.tokens.
  super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
  super__Vector_impl_data._M_start = ptStack_60;
  ptStack_60 = (pointer)0x0;
  local_58._M_current = (token *)0x0;
  ptStack_50 = (token *)0x0;
  local_48.stream.current = (size_t)local_68;
  fVar5 = detail::range_parser::parse<int,int,int>(&local_48,(range_set<int,_int,_int> *)str._M_str)
  ;
  pcVar3 = fVar5.super_from_chars_result.ptr;
  eVar4 = fVar5.super_from_chars_result.ec;
  if (local_48.stream.tokens.
      super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.stream.tokens.
                    super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.stream.tokens.
                          super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.stream.tokens.
                          super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_00165caf:
  if (ptStack_60 != (pointer)0x0) {
    operator_delete(ptStack_60,(long)ptStack_50 - (long)ptStack_60);
  }
  fVar5.super_from_chars_result.ec = eVar4;
  fVar5.super_from_chars_result.ptr = pcVar3;
  fVar5.super_from_chars_result._12_4_ = 0;
  return (from_chars_result)fVar5.super_from_chars_result;
}

Assistant:

SEMVER_CONSTEXPR from_chars_result parse(std::string_view str, range_set<I1, I2, I3>& out) {
  detail::token_stream token_stream;
  const from_chars_result result =  detail::lexer{ str }.scan_tokens(token_stream);
  if (!result) {
    return result;
  }

  return detail::range_parser{ std::move(token_stream) }.parse(out);
}